

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O2

void __thiscall
duckdb::BatchedBufferedData::BatchedBufferedData
          (BatchedBufferedData *this,weak_ptr<duckdb::ClientContext,_true> *context)

{
  _Rb_tree_header *p_Var1;
  idx_t iVar2;
  double dVar3;
  ulong uVar4;
  double dVar5;
  weak_ptr<duckdb::ClientContext,_true> local_28;
  
  local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BufferedData::BufferedData(&this->super_BufferedData,BATCHED,&local_28);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_28.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->super_BufferedData)._vptr_BufferedData = (_func_int **)&PTR__BatchedBufferedData_017a87f8;
  p_Var1 = &(this->buffer)._M_t._M_impl.super__Rb_tree_header;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i = 0;
  ::std::
  _Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ::_Deque_base(&(this->read_queue).
                 super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
               );
  (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i = 0;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->min_batch = 0;
  this->lowest_moved_batch = 0;
  iVar2 = (this->super_BufferedData).total_buffer_size;
  dVar5 = ((double)CONCAT44(0x45300000,(int)(iVar2 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)iVar2) - 4503599627370496.0);
  dVar3 = dVar5 * 0.6;
  uVar4 = (ulong)dVar3;
  this->read_queue_capacity = (long)(dVar3 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  dVar5 = dVar5 * 0.4;
  uVar4 = (ulong)dVar5;
  this->buffer_capacity = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  return;
}

Assistant:

BatchedBufferedData::BatchedBufferedData(weak_ptr<ClientContext> context)
    : BufferedData(BufferedData::Type::BATCHED, std::move(context)), buffer_byte_count(0), read_queue_byte_count(0),
      min_batch(0) {
	read_queue_capacity = (idx_t)(static_cast<double>(total_buffer_size) * 0.6);
	buffer_capacity = (idx_t)(static_cast<double>(total_buffer_size) * 0.4);
}